

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlBinary.cpp
# Opt level: O0

void __thiscall libebml::EbmlBinary::EbmlBinary(EbmlBinary *this,EbmlBinary *ElementToClone)

{
  binary *__src;
  int iVar1;
  undefined4 extraout_var;
  binary *pbVar2;
  undefined4 extraout_var_00;
  EbmlBinary *ElementToClone_local;
  EbmlBinary *this_local;
  
  EbmlElement::EbmlElement(&this->super_EbmlElement,&ElementToClone->super_EbmlElement);
  (this->super_EbmlElement)._vptr_EbmlElement = (_func_int **)&PTR__EbmlBinary_00237188;
  if (ElementToClone->Data == (binary *)0x0) {
    this->Data = (binary *)0x0;
  }
  else {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    pbVar2 = (binary *)malloc(CONCAT44(extraout_var,iVar1));
    this->Data = pbVar2;
    if (this->Data == (binary *)0x0) {
      __assert_fail("Data != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlBinary.cpp"
                    ,0x38,"libebml::EbmlBinary::EbmlBinary(const EbmlBinary &)");
    }
    pbVar2 = this->Data;
    __src = ElementToClone->Data;
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    memcpy(pbVar2,__src,CONCAT44(extraout_var_00,iVar1));
  }
  return;
}

Assistant:

EbmlBinary::EbmlBinary(const EbmlBinary & ElementToClone)
  :EbmlElement(ElementToClone)
{
  if (ElementToClone.Data == NULL)
    Data = NULL;
  else {
    Data = (binary *)malloc(GetSize() * sizeof(binary));
    assert(Data != NULL);
    memcpy(Data, ElementToClone.Data, GetSize());
  }
}